

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall
chaiscript::exception::file_not_found_error::file_not_found_error
          (file_not_found_error *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  std::operator+(&bStack_28,"File Not Found: ",t_filename);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&bStack_28);
  std::__cxx11::string::~string((string *)&bStack_28);
  *(undefined ***)this = &PTR__runtime_error_0032d338;
  return;
}

Assistant:

file_not_found_error(const std::string &t_filename) CHAISCRIPT_NOEXCEPT
        : std::runtime_error("File Not Found: " + t_filename)
      { }